

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBodyVisitor.cpp
# Opt level: O1

void __thiscall OpenMD::LipidHeadVisitor::visit(LipidHeadVisitor *this,RigidBody *rb)

{
  char *pcVar1;
  double dVar2;
  int iVar3;
  undefined8 uVar4;
  bool bVar5;
  undefined1 auVar6 [8];
  iterator iVar7;
  long lVar8;
  undefined8 *puVar9;
  element_type *peVar10;
  ostream *poVar11;
  uint i;
  uint j;
  long lVar12;
  _Base_ptr this_00;
  element_type *peVar13;
  _Base_ptr this_01;
  Vector<double,_3U> result;
  RotMat3x3d rotMatrix;
  _Base_ptr local_168;
  undefined1 local_158 [80];
  undefined1 local_108 [8];
  _Base_ptr p_Stack_100;
  int local_ec;
  shared_ptr<OpenMD::GenericData> local_e8;
  value_type local_d8;
  _func_int **local_c8;
  undefined1 local_c0 [16];
  _Base_ptr p_Stack_b0;
  _Base_ptr local_a8;
  _Base_ptr p_Stack_a0;
  double local_98 [4];
  undefined8 local_78 [9];
  
  local_98[0] = 0.0;
  local_98[1] = 0.0;
  local_98[2] = 1.0;
  local_78[6] = 0;
  local_78[7] = 0;
  local_78[4] = 0;
  local_78[5] = 0;
  local_78[2] = 0;
  local_78[3] = 0;
  local_78[0] = 0;
  local_78[1] = 0;
  local_78[8] = 0;
  (*(rb->super_StuntDouble)._vptr_StuntDouble[7])(local_158);
  iVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&(this->lipidHeadName)._M_t,(key_type *)local_158);
  pcVar1 = local_158 + 0x10;
  if ((char *)local_158._0_8_ != pcVar1) {
    operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
  }
  if ((_Rb_tree_header *)iVar7._M_node == &(this->lipidHeadName)._M_t._M_impl.super__Rb_tree_header)
  {
    local_168 = (_Base_ptr)0x0;
    this_01 = (_Base_ptr)0x0;
    this_00 = (_Base_ptr)0x0;
  }
  else {
    iVar3 = (rb->super_StuntDouble).globalIndex_;
    lVar12 = (long)(rb->super_StuntDouble).localIndex_;
    lVar8 = *(long *)((long)&(((rb->super_StuntDouble).snapshotMan_)->currentSnapshot_->atomData).
                             position.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start +
                     (rb->super_StuntDouble).storage_);
    puVar9 = (undefined8 *)(lVar8 + lVar12 * 0x18);
    local_a8 = (_Base_ptr)*puVar9;
    p_Stack_a0 = (_Base_ptr)puVar9[1];
    local_c0._0_8_ = *(undefined8 *)(lVar8 + 0x10 + lVar12 * 0x18);
    StuntDouble::getA((RotMat3x3d *)local_158,&rb->super_StuntDouble);
    lVar8 = 0;
    do {
      *(undefined8 *)((long)local_78 + lVar8 + 0x10) = *(undefined8 *)(local_158 + lVar8 + 0x10);
      uVar4 = *(undefined8 *)(local_158 + lVar8 + 8);
      *(undefined8 *)((long)local_78 + lVar8) = *(undefined8 *)(local_158 + lVar8);
      *(undefined8 *)((long)local_78 + lVar8 + 8) = uVar4;
      lVar8 = lVar8 + 0x18;
    } while (lVar8 != 0x48);
    local_158._0_8_ = (pointer)0x0;
    local_158._8_8_ = (_Base_ptr)0x0;
    local_158._16_8_ = 0;
    puVar9 = local_78;
    lVar8 = 0;
    do {
      dVar2 = *(double *)(local_158 + lVar8 * 8);
      lVar12 = 0;
      do {
        dVar2 = dVar2 + (double)puVar9[lVar12] * local_98[lVar12];
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      *(double *)(local_158 + lVar8 * 8) = dVar2;
      lVar8 = lVar8 + 1;
      puVar9 = puVar9 + 3;
    } while (lVar8 != 3);
    local_c0._8_8_ = local_158._0_8_;
    p_Stack_b0 = (_Base_ptr)local_158._8_8_;
    local_c8 = (_func_int **)local_158._16_8_;
    local_158._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"ATOMDATA","");
    StuntDouble::getPropertyByName((StuntDouble *)local_108,(string *)rb);
    this_00 = p_Stack_100;
    auVar6 = local_108;
    p_Stack_100 = (_Base_ptr)0x0;
    local_108 = (undefined1  [8])0x0;
    if ((char *)local_158._0_8_ != pcVar1) {
      operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
    }
    local_ec = iVar3;
    if (auVar6 == (undefined1  [8])0x0) {
      local_158._0_8_ = (pointer)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<OpenMD::AtomData,std::allocator<OpenMD::AtomData>>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_158 + 8),
                 (AtomData **)local_158,(allocator<OpenMD::AtomData> *)local_108);
      local_168 = (_Base_ptr)local_158._8_8_;
      local_158._8_8_ = (_Base_ptr)0x0;
      bVar5 = false;
      peVar13 = (element_type *)local_158._0_8_;
    }
    else {
      peVar10 = (element_type *)__dynamic_cast(auVar6,&GenericData::typeinfo,&AtomData::typeinfo,0);
      local_168 = (_Base_ptr)0x0;
      peVar13 = (element_type *)0x0;
      if ((peVar10 != (element_type *)0x0) &&
         (local_168 = this_00, peVar13 = peVar10, this_00 != (_Base_ptr)0x0)) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
          UNLOCK();
        }
        else {
          *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
        }
      }
      bVar5 = true;
      if (peVar13 == (element_type *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"can not get Atom Data from ",0x1b);
        (*(rb->super_StuntDouble)._vptr_StuntDouble[7])(local_158,rb);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,(char *)local_158._0_8_,local_158._8_8_);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        if ((char *)local_158._0_8_ != pcVar1) {
          operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
        }
        local_158._0_8_ = (pointer)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<OpenMD::AtomData,std::allocator<OpenMD::AtomData>>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_158 + 8),
                   (AtomData **)local_158,(allocator<OpenMD::AtomData> *)local_108);
        uVar4 = local_158._8_8_;
        peVar13 = (element_type *)local_158._0_8_;
        local_158._0_8_ = (pointer)0x0;
        local_158._8_8_ = (_Base_ptr)0x0;
        if (local_168 != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168);
        }
        if ((_Base_ptr)local_158._8_8_ != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
        }
        bVar5 = false;
        local_168 = (_Base_ptr)uVar4;
      }
    }
    local_158._0_8_ = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<OpenMD::AtomInfo,std::allocator<OpenMD::AtomInfo>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_158 + 8),(AtomInfo **)local_158,
               (allocator<OpenMD::AtomInfo> *)local_108);
    this_01 = (_Base_ptr)local_158._8_8_;
    uVar4 = local_158._0_8_;
    local_158._8_8_ = 0.0;
    local_158._0_8_ = (char *)0x0;
    std::__cxx11::string::_M_replace(uVar4,0,*(char **)(uVar4 + 8),0x25fb0e);
    *(int *)(uVar4 + 0x20) = local_ec;
    *(_Base_ptr *)(uVar4 + 0x28) = local_a8;
    *(_Base_ptr *)(uVar4 + 0x30) = p_Stack_a0;
    *(undefined8 *)(uVar4 + 0x38) = local_c0._0_8_;
    *(undefined8 *)(uVar4 + 0x40) = local_c0._8_8_;
    *(_Base_ptr *)(uVar4 + 0x48) = p_Stack_b0;
    *(_func_int ***)(uVar4 + 0x50) = local_c8;
    local_d8.super___shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar4;
    local_d8.super___shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01;
    if (this_01 != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)((long)this_01 + 8) = *(int *)((long)this_01 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)((long)this_01 + 8) = *(int *)((long)this_01 + 8) + 1;
      }
    }
    std::
    vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>::
    push_back((vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>
               *)(peVar13 + 1),&local_d8);
    if ((_Base_ptr)
        local_d8.super___shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_d8.super___shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (!bVar5) {
      local_158._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"ATOMDATA","");
      std::__cxx11::string::_M_assign((string *)&peVar13->id_);
      if ((char *)local_158._0_8_ != pcVar1) {
        operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
      }
      local_e8.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168;
      if (local_168 != (_Base_ptr)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&local_168->_M_parent = *(int *)&local_168->_M_parent + 1;
          UNLOCK();
        }
        else {
          *(int *)&local_168->_M_parent = *(int *)&local_168->_M_parent + 1;
        }
      }
      local_e8.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar13;
      StuntDouble::addProperty(&rb->super_StuntDouble,&local_e8);
      if ((_Base_ptr)
          local_e8.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_e8.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
  }
  if (this_01 != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
  }
  if (local_168 != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168);
  }
  if (this_00 != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
  }
  return;
}

Assistant:

void LipidHeadVisitor::visit(RigidBody* rb) {
    int globalID;
    Vector3d pos;
    Vector3d u(0, 0, 1);
    Vector3d newVec;
    std::shared_ptr<GenericData> data;
    std::shared_ptr<AtomData> atomData;
    std::shared_ptr<AtomInfo> atomInfo;
    bool haveAtomData;
    RotMat3x3d rotMatrix;

    if (!canVisit(rb->getType())) return;

    globalID  = rb->getGlobalIndex();
    pos       = rb->getPos();
    rotMatrix = rb->getA();
    // matVecMul3(rotMatrix, u, newVec);
    newVec = rotMatrix * u;

    data = rb->getPropertyByName("ATOMDATA");

    if (data != nullptr) {
      atomData = std::dynamic_pointer_cast<AtomData>(data);

      if (atomData == nullptr) {
        std::cerr << "can not get Atom Data from " << rb->getType()
                  << std::endl;

        atomData     = std::make_shared<AtomData>();
        haveAtomData = false;

      } else
        haveAtomData = true;

    } else {
      atomData     = std::make_shared<AtomData>();
      haveAtomData = false;
    }

    atomInfo               = std::make_shared<AtomInfo>();
    atomInfo->atomTypeName = "X";
    atomInfo->globalID     = globalID;
    atomInfo->pos[0]       = pos[0];
    atomInfo->pos[1]       = pos[1];
    atomInfo->pos[2]       = pos[2];
    atomInfo->vec[0]       = newVec[0];
    atomInfo->vec[1]       = newVec[1];
    atomInfo->vec[2]       = newVec[2];

    atomData->addAtomInfo(atomInfo);

    if (!haveAtomData) {
      atomData->setID("ATOMDATA");
      rb->addProperty(atomData);
    }
  }